

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

ON_RenderContent * __thiscall ON_RenderContentPrivate::FindLastChild(ON_RenderContentPrivate *this)

{
  ON_RenderContent *pOVar1;
  ON_RenderContent *pOVar2;
  
  pOVar2 = this->m_first_child;
  if (pOVar2 != (ON_RenderContent *)0x0) {
    do {
      pOVar1 = pOVar2;
      pOVar2 = pOVar2->_private->m_next_sibling;
    } while (pOVar2 != (ON_RenderContent *)0x0);
    return pOVar1;
  }
  return (ON_RenderContent *)0x0;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindLastChild(void) const
{
  ON_RenderContent* result = nullptr;

  ON_RenderContent* candidate = m_first_child;
  while (nullptr != candidate)
  {
    result = candidate;
    candidate = candidate->_private->m_next_sibling;
  }

  return result;
}